

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O0

RigidBody * __thiscall
OpenMD::MoleculeCreator::createRigidBody
          (MoleculeCreator *this,MoleculeStamp *molStamp,Molecule *mol,RigidBodyStamp *rbStamp,
          LocalIndexManager *localIndexMan)

{
  int index;
  RigidBody *pRVar1;
  size_t sVar2;
  string s;
  size_t i;
  AtomStamp *in_stack_000000c0;
  RigidBody *rb;
  AtomStamp *atomStamp;
  Vector3d refCoor;
  size_t nAtoms;
  Atom *atom;
  RigidBody *in_stack_000002c0;
  Molecule *in_stack_fffffffffffffed8;
  MoleculeStamp *in_stack_fffffffffffffee0;
  RigidBody *this_00;
  RigidBody *__lhs;
  string local_f8 [8];
  RigidBody *in_stack_ffffffffffffff10;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  ulong uVar3;
  
  Vector3<double>::Vector3((Vector3<double> *)0x1eab0c);
  pRVar1 = (RigidBody *)operator_new(0x188);
  RigidBody::RigidBody(in_stack_ffffffffffffff10);
  sVar2 = RigidBodyStamp::getNMembers((RigidBodyStamp *)0x1eab42);
  for (uVar3 = 0; uVar3 < sVar2; uVar3 = uVar3 + 1) {
    RigidBodyStamp::getMemberAt
              ((RigidBodyStamp *)in_stack_fffffffffffffee0,
               (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    Molecule::getAtomAt((Molecule *)in_stack_fffffffffffffee0,
                        (uint)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    RigidBodyStamp::getMemberAt
              ((RigidBodyStamp *)in_stack_fffffffffffffee0,
               (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    MoleculeStamp::getAtomStamp
              (in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    RigidBody::addAtom((RigidBody *)atomStamp,(Atom *)rb,in_stack_000000c0);
  }
  RigidBody::calcRefCoords(in_stack_000002c0);
  this_00 = pRVar1;
  index = LocalIndexManager::getNextRigidBodyIndex((LocalIndexManager *)0x1eac61);
  StuntDouble::setLocalIndex(&this_00->super_StuntDouble,index);
  Molecule::getNRigidBodies((Molecule *)0x1eac7a);
  OpenMD_itoa_abi_cxx11_((int)(uVar3 >> 0x20),(uint)uVar3);
  __lhs = pRVar1;
  Molecule::getType_abi_cxx11_(in_stack_fffffffffffffed8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)this_00);
  std::__cxx11::string::c_str();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)this_00);
  (*(__lhs->super_StuntDouble)._vptr_StuntDouble[8])(__lhs,local_b8);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_98);
  return pRVar1;
}

Assistant:

RigidBody* MoleculeCreator::createRigidBody(
      MoleculeStamp* molStamp, Molecule* mol, RigidBodyStamp* rbStamp,
      LocalIndexManager* localIndexMan) {
    Atom* atom;
    size_t nAtoms;
    Vector3d refCoor;
    AtomStamp* atomStamp;

    RigidBody* rb = new RigidBody();
    nAtoms        = rbStamp->getNMembers();
    for (std::size_t i = 0; i < nAtoms; ++i) {
      // rbStamp->getMember(i) return the local index of current atom
      // inside the molecule.  It is not the same as local index of
      // atom which is the index of atom at DataStorage class
      atom      = mol->getAtomAt(rbStamp->getMemberAt(i));
      atomStamp = molStamp->getAtomStamp(rbStamp->getMemberAt(i));
      rb->addAtom(atom, atomStamp);
    }

    // after all of the atoms are added, we need to calculate the
    // reference coordinates
    rb->calcRefCoords();

    // set the local index of this rigid body, global index will be set later
    rb->setLocalIndex(localIndexMan->getNextRigidBodyIndex());

    // The rule for naming a rigidbody is: MoleculeName_RB_Integer
    // The first part is the name of the molecule
    // The second part is always fixed as "RB"
    // The third part is the index of the rigidbody defined in meta-data file
    // For example, Butane_RB_0 is a valid rigid body name of butane molecule

    std::string s = OpenMD_itoa(mol->getNRigidBodies(), 10);
    rb->setType(mol->getType() + "_RB_" + s.c_str());
    return rb;
  }